

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall glu::sl::ShaderParser::assumeToken(ShaderParser *this,Token token)

{
  deBool dVar1;
  char *pcVar2;
  bool bVar3;
  allocator<char> local_ed [20];
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  Token local_14;
  ShaderParser *pSStack_10;
  Token token_local;
  ShaderParser *this_local;
  
  local_14 = token;
  pSStack_10 = this;
  if (this->m_curToken != token) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"unexpected token \'",&local_d9);
    std::operator+(&local_b8,&local_d8,&this->m_curTokenStr);
    std::operator+(&local_98,&local_b8,"\', expecting \'");
    pcVar2 = getTokenName(this,local_14);
    std::operator+(&local_78,&local_98,pcVar2);
    std::operator+(&local_58,&local_78,"\'");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar2,local_ed);
    parseError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(local_ed);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  do {
    dVar1 = ::deGetFalse();
    bVar3 = false;
    if (dVar1 == 0) {
      bVar3 = this->m_curToken == local_14;
    }
    if (!bVar3) {
      deAssertFail("m_curToken == token",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderLibrary.cpp"
                   ,0x31d);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  return;
}

Assistant:

void ShaderParser::assumeToken (Token token)
{
	if (m_curToken != token)
		parseError((string("unexpected token '") + m_curTokenStr + "', expecting '" + getTokenName(token) + "'").c_str());
	DE_TEST_ASSERT(m_curToken == token);
}